

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

int async_ctx_free(void)

{
  int iVar1;
  async_ctx *ptr;
  async_ctx *ctx;
  CRYPTO_THREAD_LOCAL *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  ptr = async_get_ctx();
  iVar1 = CRYPTO_THREAD_set_local(in_stack_ffffffffffffffe8,(void *)0x38761e);
  if (iVar1 != 0) {
    CRYPTO_free(ptr);
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

static int async_ctx_free(void)
{
    async_ctx *ctx;

    ctx = async_get_ctx();

    if (!CRYPTO_THREAD_set_local(&ctxkey, NULL))
        return 0;

    OPENSSL_free(ctx);

    return 1;
}